

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::MapHelper<unsigned_int>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              uint length,Arguments *args,ScriptContext *scriptContext)

{
  uint uVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  double value;
  anon_class_24_1_2f014396_conflict2 implicitCall;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  Var pvVar8;
  RecyclableObject *callBackFn;
  TypedArrayBase *pTVar9;
  TypedArrayBase *instanceObj;
  undefined4 *puVar10;
  JavascriptArray *pJVar11;
  JavascriptArray *aValue;
  JavascriptCopyOnAccessNativeIntArray *this;
  JavascriptMethod p_Var12;
  uint64 uVar13;
  uint64 uVar14;
  undefined4 extraout_var;
  char16_t *varName;
  uint32 index;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  byte bVar18;
  JavascriptArray *local_e0;
  undefined1 auStack_d8 [8];
  Var element;
  ScriptContext *local_c8;
  TypedArrayBase *local_c0;
  ulong local_b8;
  TypedArrayBase *local_b0;
  undefined4 *local_a8;
  RecyclableObject *local_a0;
  undefined4 *local_98;
  ScriptContext *local_90;
  JavascriptArray *local_88;
  undefined1 local_80 [8];
  JsReentLock jsReentLock;
  TypedArrayBase *local_48;
  bool local_31 [8];
  bool isBuiltinArrayCtor;
  
  local_80 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_80)->noJsReentrancy;
  ((ThreadContext *)local_80)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_80,pArr);
  local_31[0] = true;
  if (((ulong)args->Info & 0xfffffe) == 0) {
LAB_00ba97c2:
    varName = L"[TypedArray].prototype.map";
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      varName = L"Array.prototype.map";
    }
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec34,varName);
  }
  pvVar8 = Arguments::operator[](args,1);
  bVar5 = JavascriptConversion::IsCallable(pvVar8);
  if (!bVar5) goto LAB_00ba97c2;
  pvVar8 = Arguments::operator[](args,1);
  callBackFn = VarTo<Js::RecyclableObject>(pvVar8);
  if ((*(uint *)&args->Info & 0xffffff) < 3) {
    local_a0 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  else {
    local_a0 = (RecyclableObject *)Arguments::operator[](args,2);
  }
  local_48 = typedArrayBase;
  if ((pArr == (JavascriptArray *)0x0 && typedArrayBase == (TypedArrayBase *)0x0) &&
     (bVar5 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(obj), bVar5)) {
    local_48 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
  }
  if (typedArrayBase == (TypedArrayBase *)0x0) {
    *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    pJVar11 = (JavascriptArray *)
              ArraySpeciesCreate<unsigned_int>
                        (obj,length,scriptContext,(bool *)0x0,(bool *)0x0,local_31);
  }
  else {
    pvVar8 = Arguments::operator[](args,0);
    pTVar9 = (TypedArrayBase *)TypedArrayBase::GetDefaultConstructor(pvVar8,scriptContext);
    *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    instanceObj = (TypedArrayBase *)
                  JavascriptOperators::SpeciesConstructor
                            ((RecyclableObject *)local_48,(JavascriptFunction *)pTVar9,scriptContext
                            );
    JsReentLock::MutateArrayObject((JsReentLock *)local_80);
    *(bool *)((long)local_80 + 0x108) = true;
    local_31[0] = false;
    bVar5 = JavascriptOperators::IsConstructor((RecyclableObject *)instanceObj);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x25cd,"(JavascriptOperators::IsConstructor(constructor))",
                                  "JavascriptOperators::IsConstructor(constructor)");
      if (!bVar5) goto LAB_00ba98aa;
      *puVar10 = 0;
    }
    *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    pTVar2 = scriptContext->threadContext;
    auStack_d8 = (undefined1  [8])instanceObj;
    element._0_4_ = length;
    local_c8 = scriptContext;
    if (instanceObj == pTVar9) {
      bVar5 = pTVar2->reentrancySafeOrHandled;
      pTVar2->reentrancySafeOrHandled = true;
      pvVar8 = anon_func::anon_class_24_1_2f014396::
               anon_class_24_3_af332ec1_for_newObjectCreationFunction::operator()
                         ((anon_class_24_3_af332ec1_for_newObjectCreationFunction *)auStack_d8);
      pTVar2->reentrancySafeOrHandled = bVar5;
    }
    else {
      implicitCall.newObjectCreationFunction._12_4_ = element._4_4_;
      implicitCall.newObjectCreationFunction.length = length;
      implicitCall.newObjectCreationFunction.constructor = (RecyclableObject *)instanceObj;
      implicitCall.newObjectCreationFunction.scriptContext = scriptContext;
      pvVar8 = ThreadContext::
               ExecuteImplicitCall<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_lib_Runtime___Language_JavascriptOperators_inl:168:95)>
                         (pTVar2,(RecyclableObject *)instanceObj,ImplicitCall_Accessor,implicitCall)
      ;
    }
    pJVar11 = (JavascriptArray *)VarTo<Js::RecyclableObject>(pvVar8);
    JsReentLock::MutateArrayObject((JsReentLock *)local_80);
  }
  *(bool *)((long)local_80 + 0x108) = true;
  if (pJVar11 == (JavascriptArray *)0x0) {
    pJVar11 = JavascriptLibrary::CreateArray
                        ((scriptContext->super_ScriptContextBase).javascriptLibrary,length);
    jsReentLock._24_8_ = pJVar11;
    if ((pJVar11->head).ptr == EmptySegment) {
      AllocateHead<void*>(pJVar11);
    }
  }
  else {
    bVar5 = IsNonES5Array(pJVar11);
    if (bVar5) {
      aValue = UnsafeVarTo<Js::JavascriptArray>(pJVar11);
    }
    else {
      aValue = (JavascriptArray *)0x0;
    }
    if (aValue == (JavascriptArray *)0x0) {
      jsReentLock._24_8_ = (JavascriptArray *)0x0;
    }
    else {
      bVar5 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(aValue);
      if (bVar5) {
        this = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(aValue);
      }
      else {
        this = (JavascriptCopyOnAccessNativeIntArray *)0x0;
      }
      if (this != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
        JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this);
      }
      JsReentLock::setSecondObjectForMutation((JsReentLock *)local_80,aValue);
      jsReentLock._24_8_ = aValue;
    }
  }
  auStack_d8 = (undefined1  [8])0x0;
  local_88 = pJVar11;
  if (pArr == (JavascriptArray *)0x0) {
    pArr = (JavascriptArray *)0x0;
  }
  else {
    bVar5 = IsNonES5Array(obj);
    if (!bVar5) {
      bVar5 = VarIs<Js::ES5Array,Js::RecyclableObject>(obj);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2602,"(VarIs<ES5Array>(obj))",
                                    "The array should have been converted to an ES5Array");
        if (!bVar5) goto LAB_00ba98aa;
        *puVar10 = 0;
      }
      pArr = (JavascriptArray *)0x0;
    }
  }
  if ((TypedArrayBase *)pArr == (TypedArrayBase *)0x0) {
    if (local_48 == (TypedArrayBase *)0x0) {
      *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      pJVar11 = (JavascriptArray *)
                MapObjectHelper<unsigned_int>
                          (obj,length,0,(RecyclableObject *)local_88,
                           (JavascriptArray *)jsReentLock._24_8_,local_31[0],callBackFn,local_a0,
                           scriptContext);
      goto LAB_00ba9799;
    }
    bVar5 = VarIsCorrectType<Js::TypedArrayBase>(local_48);
    pJVar11 = local_88;
    if (!bVar5) {
      bVar5 = VarIsCorrectType<Js::TypedArrayBase>(local_48);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2632,"(VarIsCorrectType(typedArrayBase))",
                                    "VarIsCorrectType(typedArrayBase)");
        if (!bVar5) goto LAB_00ba98aa;
        *puVar10 = 0;
      }
      Throw::FatalInternalError(-0x7fffbffb);
    }
    bVar5 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)local_88);
    uVar4 = jsReentLock._24_8_;
    if (bVar5) {
      pTVar9 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)pJVar11);
    }
    else {
      pTVar9 = (TypedArrayBase *)0x0;
    }
    if (uVar4 == 0 && pTVar9 == (TypedArrayBase *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2639,"(newArr != nullptr)","newArr != nullptr");
      if (bVar5) {
        *puVar10 = 0;
        Throw::FatalInternalError(-0x7fffbffb);
      }
LAB_00ba98aa:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    uVar1 = (local_48->super_ArrayBufferParent).super_ArrayObject.length;
    if (uVar1 < length) {
      length = uVar1;
    }
    if (length != 0) {
      local_98 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar15 = 0;
      local_c0 = pTVar9;
      local_b8 = (ulong)length;
      do {
        iVar7 = (*(local_48->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x72])(local_48,uVar15 & 0xffffffff);
        auStack_d8 = (undefined1  [8])CONCAT44(extraout_var,iVar7);
        *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pTVar2 = scriptContext->threadContext;
        local_90 = (ScriptContext *)CONCAT71(local_90._1_7_,pTVar2->reentrancySafeOrHandled);
        pTVar2->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar2);
        if (scriptContext->threadContext->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var12 = RecyclableObject::GetEntryPoint(callBackFn);
        CheckIsExecutable(callBackFn,p_Var12);
        p_Var12 = RecyclableObject::GetEntryPoint(callBackFn);
        local_b0 = (TypedArrayBase *)auStack_d8;
        if ((int)uVar15 < 0) {
          value = (double)(uVar15 & 0xffffffff);
          uVar13 = NumberUtilities::ToSpecial(value);
          bVar5 = NumberUtilities::IsNan(value);
          if (((bVar5) && (uVar14 = NumberUtilities::ToSpecial(value), uVar14 != 0xfff8000000000000)
              ) && (uVar14 = NumberUtilities::ToSpecial(value), uVar14 != 0x7ff8000000000000)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *local_98 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar5) goto LAB_00ba98aa;
            *local_98 = 0;
          }
          uVar17 = uVar13 ^ 0xfffc000000000000;
        }
        else {
          uVar17 = uVar15 + 0x1000000000000;
        }
        pvVar8 = (*p_Var12)(callBackFn,(CallInfo)callBackFn,0x2000004,0,0,0,0,0x2000004,local_a0,
                            local_b0,uVar17,obj);
        pTVar2->reentrancySafeOrHandled = local_90._0_1_;
        JsReentLock::MutateArrayObject((JsReentLock *)local_80);
        *(bool *)((long)local_80 + 0x108) = true;
        if (local_c0 == (TypedArrayBase *)0x0) {
          (**(code **)(*(long *)jsReentLock._24_8_ + 0x148))
                    (jsReentLock._24_8_,uVar15 & 0xffffffff,pvVar8,0);
        }
        else {
          *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          (*(local_c0->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x70])(local_c0,uVar15 & 0xffffffff,pvVar8);
          JsReentLock::MutateArrayObject((JsReentLock *)local_80);
          *(bool *)((long)local_80 + 0x108) = true;
        }
        uVar15 = uVar15 + 1;
      } while (local_b8 != uVar15);
    }
  }
  else {
    bVar18 = length != 0;
    if ((bool)bVar18) {
      local_b0 = (TypedArrayBase *)pArr;
      local_90 = scriptContext;
      local_a8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar17 = 1;
      uVar15 = 0;
      do {
        local_b8 = CONCAT71(local_b8._1_7_,bVar18);
        *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        index = (uint32)uVar15;
        iVar7 = (*(local_b0->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x71])(local_b0,uVar15 & 0xffffffff,auStack_d8);
        JsReentLock::MutateArrayObject((JsReentLock *)local_80);
        *(bool *)((long)local_80 + 0x108) = true;
        if (iVar7 == 0) {
          iVar7 = 0xc;
        }
        else {
          *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          pTVar2 = local_90->threadContext;
          bVar5 = pTVar2->reentrancySafeOrHandled;
          pTVar2->reentrancySafeOrHandled = true;
          ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar2);
          if (local_90->threadContext->noJsReentrancy == true) {
            Throw::FatalJsReentrancyError();
          }
          p_Var12 = RecyclableObject::GetEntryPoint(callBackFn);
          CheckIsExecutable(callBackFn,p_Var12);
          p_Var12 = RecyclableObject::GetEntryPoint(callBackFn);
          local_c0 = (TypedArrayBase *)auStack_d8;
          if ((int)index < 0) {
            local_98 = (undefined4 *)(double)(uVar15 & 0xffffffff);
            uVar13 = NumberUtilities::ToSpecial((double)local_98);
            bVar6 = NumberUtilities::IsNan((double)local_98);
            if (((bVar6) &&
                (uVar14 = NumberUtilities::ToSpecial((double)local_98), uVar14 != 0xfff8000000000000
                )) && (uVar14 = NumberUtilities::ToSpecial((double)local_98),
                      uVar14 != 0x7ff8000000000000)) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *local_a8 = 1;
              bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                          ,0xa2,
                                          "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                          ,"We should only produce a NaN with this value");
              if (!bVar6) goto LAB_00ba98aa;
              *local_a8 = 0;
            }
            uVar16 = uVar13 ^ 0xfffc000000000000;
          }
          else {
            uVar16 = uVar15 + 0x1000000000000;
          }
          pvVar8 = (*p_Var12)(callBackFn,(CallInfo)callBackFn,0x2000004,0,0,0,0,0x2000004,local_a0,
                              local_c0,uVar16,local_b0);
          pTVar2->reentrancySafeOrHandled = bVar5;
          JsReentLock::MutateArrayObject((JsReentLock *)local_80);
          *(bool *)((long)local_80 + 0x108) = true;
          if ((jsReentLock._24_8_ == 0) || (local_31[0] != true)) {
            *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            iVar7 = (*(local_88->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x29])(local_88,uVar15 & 0xffffffff,pvVar8);
            ThrowErrorOnFailure(iVar7,local_90,index);
            JsReentLock::MutateArrayObject((JsReentLock *)local_80);
            *(bool *)((long)local_80 + 0x108) = true;
          }
          else {
            DirectSetItemAt<void*>((JavascriptArray *)jsReentLock._24_8_,index,pvVar8);
          }
          bVar5 = IsNonES5Array(obj);
          iVar7 = 0;
          if (!bVar5) {
            bVar5 = VarIs<Js::ES5Array,Js::RecyclableObject>(obj);
            if (!bVar5) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *local_a8 = 1;
              bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                          ,0x262b,"(VarIs<ES5Array>(obj))",
                                          "The array should have been converted to an ES5Array");
              if (!bVar5) goto LAB_00ba98aa;
              *local_a8 = 0;
            }
            *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            local_e0 = (JavascriptArray *)
                       MapObjectHelper<unsigned_int>
                                 (obj,length,(uint)uVar17,(RecyclableObject *)local_88,
                                  (JavascriptArray *)jsReentLock._24_8_,local_31[0],callBackFn,
                                  local_a0,local_90);
            iVar7 = 1;
          }
        }
        if ((iVar7 != 0xc) && (iVar7 != 0)) {
          bVar18 = (byte)local_b8;
          break;
        }
        uVar15 = uVar15 + 1;
        bVar18 = uVar17 < length;
        uVar17 = uVar17 + 1;
      } while (length != uVar15);
    }
    pJVar11 = local_e0;
    if ((bVar18 & 1) != 0) goto LAB_00ba9799;
  }
  bVar5 = IsNonES5Array(local_88);
  pJVar11 = local_88;
  if (bVar5) {
    (**(code **)(*(long *)jsReentLock._24_8_ + 0x3a0))();
    pJVar11 = local_88;
  }
LAB_00ba9799:
  *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return pJVar11;
}

Assistant:

Var JavascriptArray::MapHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        RecyclableObject* newObj = nullptr;
        JavascriptArray* newArr = nullptr;
        bool isTypedArrayEntryPoint = typedArrayBase != nullptr;
        bool isBuiltinArrayCtor = true;

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            if (isTypedArrayEntryPoint)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.map"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.map"));
            }
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg;

        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        // If we came from Array.prototype.map and source object is not a JavascriptArray, source could be a TypedArray
        if (!isTypedArrayEntryPoint && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        // If the entry point is %TypedArray%.prototype.map or the source object is an Array exotic object we should try to load the constructor property
        // and use it to construct the return object.
        if (isTypedArrayEntryPoint)
        {
            JavascriptFunction* defaultConstructor = TypedArrayBase::GetDefaultConstructor(args[0], scriptContext);
            JS_REENTRANT(jsReentLock,
                RecyclableObject* constructor = JavascriptOperators::SpeciesConstructor(typedArrayBase, defaultConstructor, scriptContext));

            isBuiltinArrayCtor = false;

            AssertOrFailFast(JavascriptOperators::IsConstructor(constructor));

            bool isDefaultConstructor = constructor == defaultConstructor;
            JS_REENTRANT(jsReentLock,
                newObj = VarTo<RecyclableObject>(
                    JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
                    {
                        Js::Var constructorArgs[] = {constructor, JavascriptNumber::ToVar(length, scriptContext) };
                        Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
                        return TypedArrayBase::TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), (uint32)length, scriptContext);
                    }));
            )
        }
        // skip the typed array and "pure" array case, we still need to handle special arrays like es5array, remote array, and proxy of array.
        else
        {
            JS_REENTRANT_NO_MUTATE(jsReentLock, newObj = ArraySpeciesCreate(obj, length, scriptContext, nullptr, nullptr, &isBuiltinArrayCtor));
        }

        if (newObj == nullptr)
        {
            if (length > UINT_MAX)
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthConstructIncorrect);
            }
            newArr = scriptContext->GetLibrary()->CreateArray(static_cast<uint32>(length));
            newArr->EnsureHead<Var>();
            newObj = newArr;
        }
        else
        {
            // If the new object we created is an array, remember that as it will save us time setting properties in the object below
            newArr = JavascriptArray::TryVarToNonES5Array(newObj);
            if (newArr)
            {
#if ENABLE_COPYONACCESS_ARRAY
                JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(newArr);
#endif
                SET_SECOND_OBJECT_FOR_MUTATION(jsReentLock, newArr);
            }
        }

        Var element = nullptr;
        Var mappedValue = nullptr;
        CallInfo callBackFnInfo = CallInfo(CallFlags_Value, 4);

        // We at least have to have newObj as a valid object
        Assert(newObj);

        // The ArraySpeciesCreate call above could have converted the source array into an ES5Array. If this happens
        // we will process the array elements like an ES5Array.
        if (pArr && !JavascriptArray::IsNonES5Array(obj))
        {
            AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
            pArr = nullptr;
        }

        if (pArr != nullptr)
        {
            // If source is a JavascriptArray, newObj may or may not be an array based on what was in source's constructor property
            Assert(length <= UINT_MAX);
            for (uint32 k = 0; k < (uint32)length; k++)
            {
                JS_REENTRANT(jsReentLock, BOOL gotItem = pArr->DirectGetItemAtFull(k, &element));
                if (!gotItem)
                {
                    continue;
                }

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        mappedValue = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, callBackFnInfo, thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                pArr);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                // If newArr is a valid pointer, then we constructed an array to return. Otherwise we need to do generic object operations
                if (newArr && isBuiltinArrayCtor)
                {
                    newArr->DirectSetItemAt(k, mappedValue);
                }
                else
                {
                    JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(newObj, k, mappedValue), scriptContext, k));
                }

                // Side-effects in the callback function may have changed the source array into an ES5Array. If this happens
                // we will process the rest of the array elements like an ES5Array.
                if (!JavascriptArray::IsNonES5Array(obj))
                {
                    AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
                    JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::MapObjectHelper<T>(obj, length, k + 1, newObj, newArr, isBuiltinArrayCtor, callBackFn, thisArg, scriptContext));
                }
            }
        }
        else if (typedArrayBase != nullptr)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));

            // Source is a TypedArray, we may have tried to call a constructor, but newObj may not be a TypedArray (or an array either)
            TypedArrayBase* newTypedArray = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(newObj);

            if (!newTypedArray)
            {
                AssertAndFailFast(newArr != nullptr);
            }

            Assert(length <= UINT_MAX);
            uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

            for (uint32 k = 0; k < end; k++)
            {
                // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                element = typedArrayBase->DirectGetItem(k);
                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        mappedValue = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, callBackFnInfo, thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                obj);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                // If newObj is a TypedArray, set the mappedValue directly, otherwise it should be an array, set that item to that array
                if (newTypedArray)
                {
                    JS_REENTRANT(jsReentLock, newTypedArray->DirectSetItem(k, mappedValue));
                }
                else
                {
                    newArr->SetItem(k, mappedValue, PropertyOperation_None);
                }
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::MapObjectHelper<T>(obj, length, 0u, newObj, newArr, isBuiltinArrayCtor, callBackFn, thisArg, scriptContext));
        }

#ifdef VALIDATE_ARRAY
        if (JavascriptArray::IsNonES5Array(newObj))
        {
            newArr->ValidateArray();
        }
#endif

        return newObj;
    }